

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void freeP4(sqlite3 *db,int p4type,void *p4)

{
  FuncDef *pDef;
  sqlite3 *in_RDX;
  int in_ESI;
  long in_RDI;
  Mem *p;
  sqlite3 *in_stack_ffffffffffffffe0;
  
  if (in_RDX != (sqlite3 *)0x0) {
    pDef = (FuncDef *)(ulong)(in_ESI + 0xf);
    switch(pDef) {
    case (FuncDef *)0x0:
    case (FuncDef *)0x2:
    case (FuncDef *)0x3:
    case (FuncDef *)0xe:
      sqlite3DbFree(in_stack_ffffffffffffffe0,pDef);
      break;
    case (FuncDef *)0x4:
      if (*(long *)(in_RDI + 0x328) == 0) {
        sqlite3_free((void *)0x138c93);
      }
      break;
    case (FuncDef *)0x5:
      if (*(long *)(in_RDI + 0x328) == 0) {
        sqlite3VtabUnlock((VTable *)in_stack_ffffffffffffffe0);
      }
      break;
    case (FuncDef *)0x7:
      if (*(long *)(in_RDI + 0x328) == 0) {
        sqlite3ValueFree((sqlite3_value *)0x138cc2);
      }
      else {
        if (*(int *)&in_RDX->aDb != 0) {
          sqlite3DbFree(in_RDX,pDef);
        }
        sqlite3DbFree(in_RDX,pDef);
      }
      break;
    case (FuncDef *)0x9:
      if (*(long *)(in_RDI + 0x328) == 0) {
        sqlite3KeyInfoUnref((KeyInfo *)0x138c75);
      }
      break;
    case (FuncDef *)0xa:
      freeEphemeralFunction(in_stack_ffffffffffffffe0,pDef);
    }
  }
  return;
}

Assistant:

static void freeP4(sqlite3 *db, int p4type, void *p4){
  if( p4 ){
    assert( db );
    switch( p4type ){
      case P4_REAL:
      case P4_INT64:
      case P4_DYNAMIC:
      case P4_INTARRAY: {
        sqlite3DbFree(db, p4);
        break;
      }
      case P4_KEYINFO: {
        if( db->pnBytesFreed==0 ) sqlite3KeyInfoUnref((KeyInfo*)p4);
        break;
      }
      case P4_MPRINTF: {
        if( db->pnBytesFreed==0 ) sqlite3_free(p4);
        break;
      }
      case P4_FUNCDEF: {
        freeEphemeralFunction(db, (FuncDef*)p4);
        break;
      }
      case P4_MEM: {
        if( db->pnBytesFreed==0 ){
          sqlite3ValueFree((sqlite3_value*)p4);
        }else{
          Mem *p = (Mem*)p4;
          if( p->szMalloc ) sqlite3DbFree(db, p->zMalloc);
          sqlite3DbFree(db, p);
        }
        break;
      }
      case P4_VTAB : {
        if( db->pnBytesFreed==0 ) sqlite3VtabUnlock((VTable *)p4);
        break;
      }
    }
  }
}